

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<F3DFloor_*,_F3DFloor_*>::DoCopy
          (TArray<F3DFloor_*,_F3DFloor_*> *this,TArray<F3DFloor_*,_F3DFloor_*> *other)

{
  uint uVar1;
  F3DFloor **ppFVar2;
  uint local_1c;
  uint i;
  TArray<F3DFloor_*,_F3DFloor_*> *other_local;
  TArray<F3DFloor_*,_F3DFloor_*> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (F3DFloor **)0x0;
  }
  else {
    ppFVar2 = (F3DFloor **)
              M_Malloc_Dbg((ulong)this->Most << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                           ,0x19e);
    this->Array = ppFVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      this->Array[local_1c] = other->Array[local_1c];
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}